

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Fme7_Apu.cpp
# Opt level: O0

void __thiscall Nes_Fme7_Apu::run_until(Nes_Fme7_Apu *this,blip_time_t end_time)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int in_ESI;
  Blip_Synth<12,_1> *in_RDI;
  int count;
  int delta_1;
  blip_time_t time;
  int delta;
  int amp;
  uint period;
  int period_factor;
  Blip_Buffer *osc_output;
  int volume;
  int vol_mode;
  int mode;
  int index;
  int in_stack_ffffffffffffffa8;
  blip_time_t in_stack_ffffffffffffffac;
  int local_40;
  int local_3c;
  uint local_34;
  uint local_30;
  uint local_1c;
  int local_10;
  
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    bVar1 = *(byte *)((long)&(in_RDI->impl).buf + 7);
    bVar2 = *(byte *)((long)in_RDI->impulses + (long)(local_10 + 8) + -0x28);
    local_1c = (uint)""[(int)(bVar2 & 0xf)];
    if (*(Blip_Buffer **)(in_RDI->impulses + (long)local_10 * 8 + -8) != (Blip_Buffer *)0x0) {
      Blip_Buffer::set_modified(*(Blip_Buffer **)(in_RDI->impulses + (long)local_10 * 8 + -8));
      if (((int)(uint)bVar1 >> ((byte)local_10 & 0x1f) & 1U) != 0 || (bVar2 & 0x10) != 0) {
        local_1c = 0;
      }
      local_30 = (*(byte *)((long)in_RDI->impulses + (long)(local_10 * 2 + 1) + -0x28) & 0xf) *
                 0x1000 + (uint)*(byte *)((long)in_RDI->impulses + (long)(local_10 << 1) + -0x28) *
                          0x10;
      if ((local_30 < 0x32) && (local_1c = 0, local_30 == 0)) {
        local_30 = 0x10;
      }
      local_34 = local_1c;
      if (*(char *)((long)in_RDI->impulses + (long)local_10 + -0x1a) == '\0') {
        local_34 = 0;
      }
      if (local_34 != *(uint *)(in_RDI->impulses + (long)local_10 * 8 + -4)) {
        *(uint *)(in_RDI->impulses + (long)local_10 * 8 + -4) = local_34;
        Blip_Synth<12,_1>::offset
                  (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                   (Blip_Buffer *)0x82d190);
      }
      local_3c = *(int *)(in_RDI->impulses + 0x10) +
                 (uint)(ushort)in_RDI->impulses[(long)local_10 + -0xb];
      if (local_3c < in_ESI) {
        iVar3 = local_34 * 2 - local_1c;
        if (local_1c == 0) {
          uVar4 = (((in_ESI - local_3c) + local_30) - 1) / local_30;
          *(byte *)((long)in_RDI->impulses + (long)local_10 + -0x1a) =
               *(byte *)((long)in_RDI->impulses + (long)local_10 + -0x1a) ^ (byte)uVar4 & 1;
          local_3c = uVar4 * local_30 + local_3c;
        }
        else {
          do {
            local_40 = iVar3;
            Blip_Synth<12,_1>::offset_inline
                      (in_RDI,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                       (Blip_Buffer *)0x82d1f2);
            local_3c = local_30 + local_3c;
            iVar3 = -local_40;
          } while (local_3c < in_ESI);
          *(int *)(in_RDI->impulses + (long)local_10 * 8 + -4) = (int)(-local_40 + local_1c) >> 1;
          *(bool *)((long)in_RDI->impulses + (long)local_10 + -0x1a) = local_40 < 0;
        }
      }
      in_RDI->impulses[(long)local_10 + -0xb] = (short)local_3c - (short)in_ESI;
    }
  }
  *(int *)(in_RDI->impulses + 0x10) = in_ESI;
  return;
}

Assistant:

void Nes_Fme7_Apu::run_until( blip_time_t end_time )
{
	require( end_time >= last_time );
	
	for ( int index = 0; index < osc_count; index++ )
	{
		int mode = regs [7] >> index;
		int vol_mode = regs [010 + index];
		int volume = amp_table [vol_mode & 0x0F];
		
		Blip_Buffer* const osc_output = oscs [index].output;
		if ( !osc_output )
			continue;
		osc_output->set_modified();
		
		// check for unsupported mode
		#ifndef NDEBUG
			if ( (mode & 011) <= 001 && vol_mode & 0x1F )
				debug_printf( "FME7 used unimplemented sound mode: %02X, vol_mode: %02X\n",
						mode, vol_mode & 0x1F );
		#endif
		
		if ( (mode & 001) | (vol_mode & 0x10) )
			volume = 0; // noise and envelope aren't supported
		
		// period
		int const period_factor = 16;
		unsigned period = (regs [index * 2 + 1] & 0x0F) * 0x100 * period_factor +
				regs [index * 2] * period_factor;
		if ( period < 50 ) // around 22 kHz
		{
			volume = 0;
			if ( !period ) // on my AY-3-8910A, period doesn't have extra one added
				period = period_factor;
		}
		
		// current amplitude
		int amp = volume;
		if ( !phases [index] )
			amp = 0;
		{
			int delta = amp - oscs [index].last_amp;
			if ( delta )
			{
				oscs [index].last_amp = amp;
				synth.offset( last_time, delta, osc_output );
			}
		}
		
		blip_time_t time = last_time + delays [index];
		if ( time < end_time )
		{
			int delta = amp * 2 - volume;
			if ( volume )
			{
				do
				{
					delta = -delta;
					synth.offset_inline( time, delta, osc_output );
					time += period;
				}
				while ( time < end_time );
				
				oscs [index].last_amp = (delta + volume) >> 1;
				phases [index] = (delta > 0);
			}
			else
			{
				// maintain phase when silent
				int count = (end_time - time + period - 1) / period;
				phases [index] ^= count & 1;
				time += (blargg_long) count * period;
			}
		}
		
		delays [index] = time - end_time;
	}
	
	last_time = end_time;
}